

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mish_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::Mish_x86_fma::forward_inplace(Mish_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  float __x;
  undefined1 auVar1 [32];
  uint uVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  undefined1 (*pauVar11) [16];
  uint uVar12;
  ulong uVar13;
  undefined1 (*pauVar14) [32];
  uint uVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  bool bVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar24 [32];
  undefined1 auVar23 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar56 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  __m128 one;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar85 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar166 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [32];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float fStack_48;
  float fStack_44;
  float fStack_40;
  undefined1 auVar48 [32];
  
  uVar2 = bottom_top_blob->c;
  uVar15 = bottom_top_blob->h * bottom_top_blob->w;
  if (bottom_top_blob->elempack == 8) {
    uVar9 = 0;
    if ((int)uVar15 < 1) {
      uVar15 = 0;
    }
    if ((int)uVar2 < 1) {
      uVar2 = 0;
    }
    auVar45._8_4_ = 0x42b0c0a5;
    auVar45._0_8_ = 0x42b0c0a542b0c0a5;
    auVar45._12_4_ = 0x42b0c0a5;
    auVar45._16_4_ = 0x42b0c0a5;
    auVar45._20_4_ = 0x42b0c0a5;
    auVar45._24_4_ = 0x42b0c0a5;
    auVar45._28_4_ = 0x42b0c0a5;
    auVar91._8_4_ = 0x3f000000;
    auVar91._0_8_ = 0x3f0000003f000000;
    auVar91._12_4_ = 0x3f000000;
    auVar91._16_4_ = 0x3f000000;
    auVar91._20_4_ = 0x3f000000;
    auVar91._24_4_ = 0x3f000000;
    auVar91._28_4_ = 0x3f000000;
    auVar150._8_4_ = 0x3f318000;
    auVar150._0_8_ = 0x3f3180003f318000;
    auVar150._12_4_ = 0x3f318000;
    auVar150._16_4_ = 0x3f318000;
    auVar150._20_4_ = 0x3f318000;
    auVar150._24_4_ = 0x3f318000;
    auVar150._28_4_ = 0x3f318000;
    auVar200._8_4_ = 0xb95e8083;
    auVar200._0_8_ = 0xb95e8083b95e8083;
    auVar200._12_4_ = 0xb95e8083;
    auVar200._16_4_ = 0xb95e8083;
    auVar200._20_4_ = 0xb95e8083;
    auVar200._24_4_ = 0xb95e8083;
    auVar200._28_4_ = 0xb95e8083;
    auVar191._8_4_ = 0x3ab743ce;
    auVar191._0_8_ = 0x3ab743ce3ab743ce;
    auVar191._12_4_ = 0x3ab743ce;
    auVar191._16_4_ = 0x3ab743ce;
    auVar191._20_4_ = 0x3ab743ce;
    auVar191._24_4_ = 0x3ab743ce;
    auVar191._28_4_ = 0x3ab743ce;
    for (; uVar9 != uVar2; uVar9 = uVar9 + 1) {
      pauVar14 = (undefined1 (*) [32])
                 (bottom_top_blob->cstep * uVar9 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      uVar12 = uVar15;
      while (bVar19 = uVar12 != 0, uVar12 = uVar12 - 1, bVar19) {
        auVar1 = *pauVar14;
        auVar41 = vminps_avx(auVar45,auVar1);
        auVar113._8_4_ = 0xc2b0c0a5;
        auVar113._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar113._12_4_ = 0xc2b0c0a5;
        auVar113._16_4_ = 0xc2b0c0a5;
        auVar113._20_4_ = 0xc2b0c0a5;
        auVar113._24_4_ = 0xc2b0c0a5;
        auVar113._28_4_ = 0xc2b0c0a5;
        auVar42 = vmaxps_avx(auVar41,auVar113);
        auVar194._8_4_ = 0x3fb8aa3b;
        auVar194._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar194._12_4_ = 0x3fb8aa3b;
        auVar194._16_4_ = 0x3fb8aa3b;
        auVar194._20_4_ = 0x3fb8aa3b;
        auVar194._24_4_ = 0x3fb8aa3b;
        auVar194._28_4_ = 0x3fb8aa3b;
        auVar35 = vfmadd213ps_fma(auVar194,auVar42,auVar91);
        auVar40 = vroundps_avx(ZEXT1632(auVar35),1);
        auVar41 = vcmpps_avx(ZEXT1632(auVar35),auVar40,1);
        auVar24._8_4_ = 0x3f800000;
        auVar24._0_8_ = 0x3f8000003f800000;
        auVar24._12_4_ = 0x3f800000;
        auVar24._16_4_ = 0x3f800000;
        auVar24._20_4_ = 0x3f800000;
        auVar24._24_4_ = 0x3f800000;
        auVar24._28_4_ = 0x3f800000;
        auVar41 = vandps_avx(auVar41,auVar24);
        auVar41 = vsubps_avx(auVar40,auVar41);
        auVar35 = vfmsub231ps_fma(auVar42,auVar41,auVar150);
        auVar52 = vfnmsub231ps_fma(ZEXT1632(auVar35),auVar41,auVar200);
        auVar39 = ZEXT1632(auVar52);
        auVar42._28_4_ = auVar40._28_4_;
        auVar42._0_28_ =
             ZEXT1628(CONCAT412(auVar52._12_4_ * auVar52._12_4_,
                                CONCAT48(auVar52._8_4_ * auVar52._8_4_,
                                         CONCAT44(auVar52._4_4_ * auVar52._4_4_,
                                                  auVar52._0_4_ * auVar52._0_4_))));
        auVar133._8_4_ = 0x39506967;
        auVar133._0_8_ = 0x3950696739506967;
        auVar133._12_4_ = 0x39506967;
        auVar133._16_4_ = 0x39506967;
        auVar133._20_4_ = 0x39506967;
        auVar133._24_4_ = 0x39506967;
        auVar133._28_4_ = 0x39506967;
        auVar35 = vfmadd213ps_fma(auVar133,auVar39,auVar191);
        auVar61._8_4_ = 0x3c088908;
        auVar61._0_8_ = 0x3c0889083c088908;
        auVar61._12_4_ = 0x3c088908;
        auVar61._16_4_ = 0x3c088908;
        auVar61._20_4_ = 0x3c088908;
        auVar61._24_4_ = 0x3c088908;
        auVar61._28_4_ = 0x3c088908;
        auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar39,auVar61);
        auVar168._8_4_ = 0x3d2aa9c1;
        auVar168._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar168._12_4_ = 0x3d2aa9c1;
        auVar168._16_4_ = 0x3d2aa9c1;
        auVar168._20_4_ = 0x3d2aa9c1;
        auVar168._24_4_ = 0x3d2aa9c1;
        auVar168._28_4_ = 0x3d2aa9c1;
        auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar39,auVar168);
        auVar169._8_4_ = 0x3e2aaaaa;
        auVar169._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar169._12_4_ = 0x3e2aaaaa;
        auVar169._16_4_ = 0x3e2aaaaa;
        auVar169._20_4_ = 0x3e2aaaaa;
        auVar169._24_4_ = 0x3e2aaaaa;
        auVar169._28_4_ = 0x3e2aaaaa;
        auVar40 = ZEXT1632(auVar52);
        auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar40,auVar169);
        auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar40,auVar91);
        auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar42,auVar40);
        auVar155._0_4_ = auVar35._0_4_ + 1.0;
        auVar155._4_4_ = auVar35._4_4_ + 1.0;
        auVar155._8_4_ = auVar35._8_4_ + 1.0;
        auVar155._12_4_ = auVar35._12_4_ + 1.0;
        auVar155._16_4_ = 0x3f800000;
        auVar155._20_4_ = 0x3f800000;
        auVar155._24_4_ = 0x3f800000;
        auVar155._28_4_ = 0x3f800000;
        auVar35._0_4_ = (int)auVar41._0_4_;
        auVar35._4_4_ = (int)auVar41._4_4_;
        auVar35._8_4_ = (int)auVar41._8_4_;
        auVar35._12_4_ = (int)auVar41._12_4_;
        auVar39._16_4_ = (int)auVar41._16_4_;
        auVar39._0_16_ = auVar35;
        auVar39._20_4_ = (int)auVar41._20_4_;
        auVar39._24_4_ = (int)auVar41._24_4_;
        auVar39._28_4_ = (int)auVar41._28_4_;
        auVar52 = vpslld_avx(auVar35,0x17);
        auVar35 = vpslld_avx(auVar39._16_16_,0x17);
        auVar56._8_4_ = 0x3f800000;
        auVar56._0_8_ = 0x3f8000003f800000;
        auVar56._12_4_ = 0x3f800000;
        auVar35 = vpaddd_avx(auVar35,auVar56);
        auVar52 = vpaddd_avx(auVar52,auVar56);
        auVar41._16_16_ = auVar35;
        auVar41._0_16_ = auVar52;
        auVar160 = vfmadd213ps_fma(auVar41,auVar155,auVar24);
        auVar77._8_4_ = 0x800000;
        auVar77._0_8_ = 0x80000000800000;
        auVar77._12_4_ = 0x800000;
        auVar77._16_4_ = 0x800000;
        auVar77._20_4_ = 0x800000;
        auVar77._24_4_ = 0x800000;
        auVar77._28_4_ = 0x800000;
        auVar41 = vmaxps_avx(ZEXT1632(auVar160),auVar77);
        auVar52 = vpsrld_avx(auVar41._0_16_,0x17);
        auVar35 = vpsrld_avx(auVar41._16_16_,0x17);
        auVar170._8_4_ = 0x807fffff;
        auVar170._0_8_ = 0x807fffff807fffff;
        auVar170._12_4_ = 0x807fffff;
        auVar170._16_4_ = 0x807fffff;
        auVar170._20_4_ = 0x807fffff;
        auVar170._24_4_ = 0x807fffff;
        auVar170._28_4_ = 0x807fffff;
        auVar41 = vandps_avx(auVar170,auVar41);
        auVar40 = vorps_avx(auVar41,auVar91);
        auVar171._8_4_ = 0x3f3504f3;
        auVar171._0_8_ = 0x3f3504f33f3504f3;
        auVar171._12_4_ = 0x3f3504f3;
        auVar171._16_4_ = 0x3f3504f3;
        auVar171._20_4_ = 0x3f3504f3;
        auVar171._24_4_ = 0x3f3504f3;
        auVar171._28_4_ = 0x3f3504f3;
        auVar42 = vcmpps_avx(auVar171,auVar40,2);
        auVar41 = vandnps_avx(auVar42,auVar40);
        auVar114._8_4_ = 0xbf800000;
        auVar114._0_8_ = 0xbf800000bf800000;
        auVar114._12_4_ = 0xbf800000;
        auVar114._16_4_ = 0xbf800000;
        auVar114._20_4_ = 0xbf800000;
        auVar114._24_4_ = 0xbf800000;
        auVar114._28_4_ = 0xbf800000;
        auVar78._0_4_ = auVar41._0_4_ + auVar40._0_4_ + -1.0;
        auVar78._4_4_ = auVar41._4_4_ + auVar40._4_4_ + -1.0;
        auVar78._8_4_ = auVar41._8_4_ + auVar40._8_4_ + -1.0;
        auVar78._12_4_ = auVar41._12_4_ + auVar40._12_4_ + -1.0;
        auVar78._16_4_ = auVar41._16_4_ + auVar40._16_4_ + -1.0;
        auVar78._20_4_ = auVar41._20_4_ + auVar40._20_4_ + -1.0;
        auVar78._24_4_ = auVar41._24_4_ + auVar40._24_4_ + -1.0;
        auVar78._28_4_ = auVar41._28_4_ + auVar40._28_4_ + -1.0;
        auVar35 = vpsubd_avx(auVar35,auVar42._16_16_);
        auVar166._8_4_ = 0xffffff81;
        auVar166._0_8_ = 0xffffff81ffffff81;
        auVar166._12_4_ = 0xffffff81;
        auVar35 = vpaddd_avx(auVar35,auVar166);
        auVar52 = vpsubd_avx(auVar52,auVar42._0_16_);
        auVar52 = vpaddd_avx(auVar52,auVar166);
        auVar156._16_16_ = auVar35;
        auVar156._0_16_ = auVar52;
        auVar163._0_4_ = auVar78._0_4_ * auVar78._0_4_;
        auVar163._4_4_ = auVar78._4_4_ * auVar78._4_4_;
        auVar163._8_4_ = auVar78._8_4_ * auVar78._8_4_;
        auVar163._12_4_ = auVar78._12_4_ * auVar78._12_4_;
        auVar163._16_4_ = auVar78._16_4_ * auVar78._16_4_;
        auVar163._20_4_ = auVar78._20_4_ * auVar78._20_4_;
        auVar163._24_4_ = auVar78._24_4_ * auVar78._24_4_;
        auVar163._28_4_ = 0;
        auVar172._8_4_ = 0x3d9021bb;
        auVar172._0_8_ = 0x3d9021bb3d9021bb;
        auVar172._12_4_ = 0x3d9021bb;
        auVar172._16_4_ = 0x3d9021bb;
        auVar172._20_4_ = 0x3d9021bb;
        auVar172._24_4_ = 0x3d9021bb;
        auVar172._28_4_ = 0x3d9021bb;
        auVar178._8_4_ = 0xbdebd1b8;
        auVar178._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar178._12_4_ = 0xbdebd1b8;
        auVar178._16_4_ = 0xbdebd1b8;
        auVar178._20_4_ = 0xbdebd1b8;
        auVar178._24_4_ = 0xbdebd1b8;
        auVar178._28_4_ = 0xbdebd1b8;
        auVar35 = vfmadd213ps_fma(auVar172,auVar78,auVar178);
        auVar179._8_4_ = 0x3def251a;
        auVar179._0_8_ = 0x3def251a3def251a;
        auVar179._12_4_ = 0x3def251a;
        auVar179._16_4_ = 0x3def251a;
        auVar179._20_4_ = 0x3def251a;
        auVar179._24_4_ = 0x3def251a;
        auVar179._28_4_ = 0x3def251a;
        auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar78,auVar179);
        auVar180._8_4_ = 0xbdfe5d4f;
        auVar180._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar180._12_4_ = 0xbdfe5d4f;
        auVar180._16_4_ = 0xbdfe5d4f;
        auVar180._20_4_ = 0xbdfe5d4f;
        auVar180._24_4_ = 0xbdfe5d4f;
        auVar180._28_4_ = 0xbdfe5d4f;
        auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar78,auVar180);
        auVar181._8_4_ = 0x3e11e9bf;
        auVar181._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar181._12_4_ = 0x3e11e9bf;
        auVar181._16_4_ = 0x3e11e9bf;
        auVar181._20_4_ = 0x3e11e9bf;
        auVar181._24_4_ = 0x3e11e9bf;
        auVar181._28_4_ = 0x3e11e9bf;
        auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar78,auVar181);
        auVar182._8_4_ = 0xbe2aae50;
        auVar182._0_8_ = 0xbe2aae50be2aae50;
        auVar182._12_4_ = 0xbe2aae50;
        auVar182._16_4_ = 0xbe2aae50;
        auVar182._20_4_ = 0xbe2aae50;
        auVar182._24_4_ = 0xbe2aae50;
        auVar182._28_4_ = 0xbe2aae50;
        auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar78,auVar182);
        auVar183._8_4_ = 0x3e4cceac;
        auVar183._0_8_ = 0x3e4cceac3e4cceac;
        auVar183._12_4_ = 0x3e4cceac;
        auVar183._16_4_ = 0x3e4cceac;
        auVar183._20_4_ = 0x3e4cceac;
        auVar183._24_4_ = 0x3e4cceac;
        auVar183._28_4_ = 0x3e4cceac;
        auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar78,auVar183);
        auVar184._8_4_ = 0xbe7ffffc;
        auVar184._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar184._12_4_ = 0xbe7ffffc;
        auVar184._16_4_ = 0xbe7ffffc;
        auVar184._20_4_ = 0xbe7ffffc;
        auVar184._24_4_ = 0xbe7ffffc;
        auVar184._28_4_ = 0xbe7ffffc;
        auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar78,auVar184);
        auVar185._8_4_ = 0x3eaaaaaa;
        auVar185._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar185._12_4_ = 0x3eaaaaaa;
        auVar185._16_4_ = 0x3eaaaaaa;
        auVar185._20_4_ = 0x3eaaaaaa;
        auVar185._24_4_ = 0x3eaaaaaa;
        auVar185._28_4_ = 0x3eaaaaaa;
        auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar78,auVar185);
        auVar173._0_4_ = auVar163._0_4_ * auVar78._0_4_ * auVar35._0_4_;
        auVar173._4_4_ = auVar163._4_4_ * auVar78._4_4_ * auVar35._4_4_;
        auVar173._8_4_ = auVar163._8_4_ * auVar78._8_4_ * auVar35._8_4_;
        auVar173._12_4_ = auVar163._12_4_ * auVar78._12_4_ * auVar35._12_4_;
        auVar173._16_4_ = auVar163._16_4_ * auVar78._16_4_ * 0.0;
        auVar173._20_4_ = auVar163._20_4_ * auVar78._20_4_ * 0.0;
        auVar173._24_4_ = auVar163._24_4_ * auVar78._24_4_ * 0.0;
        auVar173._28_4_ = 0;
        auVar42 = vcvtdq2ps_avx(auVar156);
        auVar35 = vfmadd231ps_fma(auVar173,auVar42,auVar200);
        auVar35 = vfmsub231ps_fma(ZEXT1632(auVar35),auVar91,auVar163);
        auVar41 = vcmpps_avx(ZEXT1632(auVar160),_DAT_004c7360,2);
        auVar40 = vsubps_avx(ZEXT1632(auVar35),auVar78);
        auVar35 = vfmsub231ps_fma(auVar40,auVar150,auVar42);
        auVar174._8_4_ = 0xc0000000;
        auVar174._0_8_ = 0xc0000000c0000000;
        auVar174._12_4_ = 0xc0000000;
        auVar174._16_4_ = 0xc0000000;
        auVar174._20_4_ = 0xc0000000;
        auVar174._24_4_ = 0xc0000000;
        auVar174._28_4_ = 0xc0000000;
        auVar79._0_4_ = auVar35._0_4_ * -2.0;
        auVar79._4_4_ = auVar35._4_4_ * -2.0;
        auVar79._8_4_ = auVar35._8_4_ * -2.0;
        auVar79._12_4_ = auVar35._12_4_ * -2.0;
        auVar79._16_4_ = 0x80000000;
        auVar79._20_4_ = 0x80000000;
        auVar79._24_4_ = 0x80000000;
        auVar79._28_4_ = 0;
        auVar157._8_4_ = 0x7fffffff;
        auVar157._0_8_ = 0x7fffffff7fffffff;
        auVar157._12_4_ = 0x7fffffff;
        auVar157._16_4_ = 0x7fffffff;
        auVar157._20_4_ = 0x7fffffff;
        auVar157._24_4_ = 0x7fffffff;
        auVar157._28_4_ = 0x7fffffff;
        auVar41 = vblendvps_avx(auVar79,auVar157,auVar41);
        auVar41 = vminps_avx(auVar45,auVar41);
        auVar80._8_4_ = 0xc2b0c0a5;
        auVar80._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar80._12_4_ = 0xc2b0c0a5;
        auVar80._16_4_ = 0xc2b0c0a5;
        auVar80._20_4_ = 0xc2b0c0a5;
        auVar80._24_4_ = 0xc2b0c0a5;
        auVar80._28_4_ = 0xc2b0c0a5;
        auVar42 = vmaxps_avx(auVar41,auVar80);
        auVar35 = vfmadd213ps_fma(auVar194,auVar42,auVar91);
        auVar40 = vroundps_avx(ZEXT1632(auVar35),1);
        auVar41 = vcmpps_avx(ZEXT1632(auVar35),auVar40,1);
        auVar41 = vandps_avx(auVar41,auVar24);
        auVar41 = vsubps_avx(auVar40,auVar41);
        auVar35 = vfmsub231ps_fma(auVar42,auVar41,auVar150);
        auVar52 = vfnmsub231ps_fma(ZEXT1632(auVar35),auVar41,auVar200);
        auVar42 = ZEXT1632(auVar52);
        auVar40._28_4_ = auVar40._28_4_;
        auVar40._0_28_ =
             ZEXT1628(CONCAT412(auVar52._12_4_ * auVar52._12_4_,
                                CONCAT48(auVar52._8_4_ * auVar52._8_4_,
                                         CONCAT44(auVar52._4_4_ * auVar52._4_4_,
                                                  auVar52._0_4_ * auVar52._0_4_))));
        auVar35 = vfmadd213ps_fma(auVar133,auVar42,auVar191);
        auVar134._8_4_ = 0x3c088908;
        auVar134._0_8_ = 0x3c0889083c088908;
        auVar134._12_4_ = 0x3c088908;
        auVar134._16_4_ = 0x3c088908;
        auVar134._20_4_ = 0x3c088908;
        auVar134._24_4_ = 0x3c088908;
        auVar134._28_4_ = 0x3c088908;
        auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar42,auVar134);
        auVar135._8_4_ = 0x3d2aa9c1;
        auVar135._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar135._12_4_ = 0x3d2aa9c1;
        auVar135._16_4_ = 0x3d2aa9c1;
        auVar135._20_4_ = 0x3d2aa9c1;
        auVar135._24_4_ = 0x3d2aa9c1;
        auVar135._28_4_ = 0x3d2aa9c1;
        auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar42,auVar135);
        auVar136._8_4_ = 0x3e2aaaaa;
        auVar136._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar136._12_4_ = 0x3e2aaaaa;
        auVar136._16_4_ = 0x3e2aaaaa;
        auVar136._20_4_ = 0x3e2aaaaa;
        auVar136._24_4_ = 0x3e2aaaaa;
        auVar136._28_4_ = 0x3e2aaaaa;
        auVar42 = ZEXT1632(auVar52);
        auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar42,auVar136);
        auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar42,auVar91);
        auVar160 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar40,auVar42);
        auVar52._0_4_ = (int)auVar41._0_4_;
        auVar52._4_4_ = (int)auVar41._4_4_;
        auVar52._8_4_ = (int)auVar41._8_4_;
        auVar52._12_4_ = (int)auVar41._12_4_;
        auVar43._16_4_ = (int)auVar41._16_4_;
        auVar43._0_16_ = auVar52;
        auVar43._20_4_ = (int)auVar41._20_4_;
        auVar43._24_4_ = (int)auVar41._24_4_;
        auVar43._28_4_ = (int)auVar41._28_4_;
        auVar52 = vpslld_avx(auVar52,0x17);
        auVar35 = vpslld_avx(auVar43._16_16_,0x17);
        auVar35 = vpaddd_avx(auVar35,auVar56);
        auVar52 = vpaddd_avx(auVar52,auVar56);
        auVar44._16_16_ = auVar35;
        auVar44._0_16_ = auVar52;
        auVar81._0_4_ = auVar160._0_4_ + 1.0;
        auVar81._4_4_ = auVar160._4_4_ + 1.0;
        auVar81._8_4_ = auVar160._8_4_ + 1.0;
        auVar81._12_4_ = auVar160._12_4_ + 1.0;
        auVar81._16_4_ = 0x3f800000;
        auVar81._20_4_ = 0x3f800000;
        auVar81._24_4_ = 0x3f800000;
        auVar81._28_4_ = 0x3f800000;
        auVar35 = vfmadd213ps_fma(auVar44,auVar81,auVar24);
        auVar41 = vrcpps_avx(ZEXT1632(auVar35));
        auVar35 = vfmsub213ps_fma(ZEXT1632(auVar35),auVar41,auVar24);
        auVar35 = vfnmadd132ps_fma(ZEXT1632(auVar35),auVar41,auVar41);
        auVar35 = vfnmadd213ps_fma(ZEXT1632(auVar35),auVar174,auVar114);
        local_58 = auVar1._0_4_;
        fStack_54 = auVar1._4_4_;
        fStack_50 = auVar1._8_4_;
        fStack_4c = auVar1._12_4_;
        fStack_48 = auVar1._16_4_;
        fStack_44 = auVar1._20_4_;
        fStack_40 = auVar1._24_4_;
        auVar1._4_4_ = auVar35._4_4_ * fStack_54;
        auVar1._0_4_ = auVar35._0_4_ * local_58;
        auVar1._8_4_ = auVar35._8_4_ * fStack_50;
        auVar1._12_4_ = auVar35._12_4_ * fStack_4c;
        auVar1._16_4_ = fStack_48 * 0.0;
        auVar1._20_4_ = fStack_44 * 0.0;
        auVar1._24_4_ = fStack_40 * 0.0;
        auVar1._28_4_ = 0x3f800000;
        *pauVar14 = auVar1;
        pauVar14 = pauVar14 + 1;
      }
    }
  }
  else if (bottom_top_blob->elempack == 4) {
    uVar8 = 0;
    uVar9 = (ulong)uVar15;
    if ((int)uVar15 < 1) {
      uVar9 = uVar8;
    }
    uVar18 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar18 = uVar8;
    }
    auVar85._8_4_ = 0x3f800000;
    auVar85._0_8_ = 0x3f8000003f800000;
    auVar85._12_4_ = 0x3f800000;
    auVar153._8_4_ = 0x42b0c0a5;
    auVar153._0_8_ = 0x42b0c0a542b0c0a5;
    auVar153._12_4_ = 0x42b0c0a5;
    auVar165._8_4_ = 0xc2b0c0a5;
    auVar165._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar165._12_4_ = 0xc2b0c0a5;
    auVar148._8_4_ = 0x3f318000;
    auVar148._0_8_ = 0x3f3180003f318000;
    auVar148._12_4_ = 0x3f318000;
    auVar176._8_4_ = 0x3ab743ce;
    auVar176._0_8_ = 0x3ab743ce3ab743ce;
    auVar176._12_4_ = 0x3ab743ce;
    auVar123._8_4_ = 0x3c088908;
    auVar123._0_8_ = 0x3c0889083c088908;
    auVar123._12_4_ = 0x3c088908;
    for (; uVar8 != uVar18; uVar8 = uVar8 + 1) {
      pauVar11 = (undefined1 (*) [16])
                 (bottom_top_blob->cstep * uVar8 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      uVar13 = uVar9;
      while (iVar16 = (int)uVar13, uVar13 = (ulong)(iVar16 - 1), iVar16 != 0) {
        auVar35 = *pauVar11;
        auVar52 = vminps_avx(auVar35,auVar153);
        auVar56 = vmaxps_avx(auVar52,auVar165);
        auVar50._8_4_ = 0x3fb8aa3b;
        auVar50._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar50._12_4_ = 0x3fb8aa3b;
        auVar21._8_4_ = 0x3f000000;
        auVar21._0_8_ = 0x3f0000003f000000;
        auVar21._12_4_ = 0x3f000000;
        auVar52 = vfmadd213ps_fma(auVar50,auVar56,auVar21);
        auVar196._0_4_ = (int)auVar52._0_4_;
        auVar196._4_4_ = (int)auVar52._4_4_;
        auVar196._8_4_ = (int)auVar52._8_4_;
        auVar196._12_4_ = (int)auVar52._12_4_;
        auVar160 = vcvtdq2ps_avx(auVar196);
        auVar52 = vcmpps_avx(auVar52,auVar160,1);
        auVar52 = vandps_avx(auVar52,auVar85);
        auVar52 = vsubps_avx(auVar160,auVar52);
        auVar160 = vfmsub231ps_fma(auVar56,auVar52,auVar148);
        auVar67._8_4_ = 0xb95e8083;
        auVar67._0_8_ = 0xb95e8083b95e8083;
        auVar67._12_4_ = 0xb95e8083;
        auVar56 = vfnmsub231ps_fma(auVar160,auVar52,auVar67);
        auVar197._0_4_ = auVar56._0_4_ * auVar56._0_4_;
        auVar197._4_4_ = auVar56._4_4_ * auVar56._4_4_;
        auVar197._8_4_ = auVar56._8_4_ * auVar56._8_4_;
        auVar197._12_4_ = auVar56._12_4_ * auVar56._12_4_;
        auVar187._8_4_ = 0x39506967;
        auVar187._0_8_ = 0x3950696739506967;
        auVar187._12_4_ = 0x39506967;
        auVar160 = vfmadd213ps_fma(auVar187,auVar56,auVar176);
        auVar160 = vfmadd213ps_fma(auVar160,auVar56,auVar123);
        auVar26._8_4_ = 0x3d2aa9c1;
        auVar26._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar26._12_4_ = 0x3d2aa9c1;
        auVar160 = vfmadd213ps_fma(auVar160,auVar56,auVar26);
        auVar27._8_4_ = 0x3e2aaaaa;
        auVar27._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar27._12_4_ = 0x3e2aaaaa;
        auVar160 = vfmadd213ps_fma(auVar160,auVar56,auVar27);
        auVar160 = vfmadd213ps_fma(auVar160,auVar56,auVar21);
        auVar160 = vfmadd213ps_fma(auVar160,auVar197,auVar56);
        auVar159._0_4_ = auVar160._0_4_ + 1.0;
        auVar159._4_4_ = auVar160._4_4_ + 1.0;
        auVar159._8_4_ = auVar160._8_4_ + 1.0;
        auVar159._12_4_ = auVar160._12_4_ + 1.0;
        auVar51._0_4_ = (int)auVar52._0_4_;
        auVar51._4_4_ = (int)auVar52._4_4_;
        auVar51._8_4_ = (int)auVar52._8_4_;
        auVar51._12_4_ = (int)auVar52._12_4_;
        auVar52 = vpslld_avx(auVar51,0x17);
        auVar52 = vpaddd_avx(auVar52,auVar85);
        auVar23 = vfmadd213ps_fma(auVar52,auVar159,auVar85);
        auVar28._8_4_ = 0x800000;
        auVar28._0_8_ = 0x80000000800000;
        auVar28._12_4_ = 0x800000;
        auVar52 = vmaxps_avx(auVar23,auVar28);
        auVar160 = vpsrld_avx(auVar52,0x17);
        auVar29._8_4_ = 0xffffff82;
        auVar29._0_8_ = 0xffffff82ffffff82;
        auVar29._12_4_ = 0xffffff82;
        auVar160 = vpaddd_avx(auVar160,auVar29);
        auVar30._8_4_ = 0x807fffff;
        auVar30._0_8_ = 0x807fffff807fffff;
        auVar30._12_4_ = 0x807fffff;
        auVar52 = vandps_avx(auVar52,auVar30);
        auVar166 = vorps_avx(auVar52,auVar21);
        auVar56 = vcvtdq2ps_avx(auVar160);
        auVar31._8_4_ = 0x3f3504f3;
        auVar31._0_8_ = 0x3f3504f33f3504f3;
        auVar31._12_4_ = 0x3f3504f3;
        auVar160 = vcmpps_avx(auVar166,auVar31,1);
        auVar52 = vandps_avx(auVar160,auVar166);
        auVar32._0_4_ = auVar166._0_4_ + -1.0 + auVar52._0_4_;
        auVar32._4_4_ = auVar166._4_4_ + -1.0 + auVar52._4_4_;
        auVar32._8_4_ = auVar166._8_4_ + -1.0 + auVar52._8_4_;
        auVar32._12_4_ = auVar166._12_4_ + -1.0 + auVar52._12_4_;
        auVar52 = vandps_avx(auVar160,auVar85);
        auVar160 = vsubps_avx(auVar56,auVar52);
        auVar161._0_4_ = auVar32._0_4_ * auVar32._0_4_;
        auVar161._4_4_ = auVar32._4_4_ * auVar32._4_4_;
        auVar161._8_4_ = auVar32._8_4_ * auVar32._8_4_;
        auVar161._12_4_ = auVar32._12_4_ * auVar32._12_4_;
        auVar198._8_4_ = 0x3d9021bb;
        auVar198._0_8_ = 0x3d9021bb3d9021bb;
        auVar198._12_4_ = 0x3d9021bb;
        auVar93._8_4_ = 0xbdebd1b8;
        auVar93._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar93._12_4_ = 0xbdebd1b8;
        auVar52 = vfmadd213ps_fma(auVar198,auVar32,auVar93);
        auVar94._8_4_ = 0x3def251a;
        auVar94._0_8_ = 0x3def251a3def251a;
        auVar94._12_4_ = 0x3def251a;
        auVar52 = vfmadd213ps_fma(auVar52,auVar32,auVar94);
        auVar95._8_4_ = 0xbdfe5d4f;
        auVar95._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar95._12_4_ = 0xbdfe5d4f;
        auVar52 = vfmadd213ps_fma(auVar52,auVar32,auVar95);
        auVar96._8_4_ = 0x3e11e9bf;
        auVar96._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar96._12_4_ = 0x3e11e9bf;
        auVar52 = vfmadd213ps_fma(auVar52,auVar32,auVar96);
        auVar97._8_4_ = 0xbe2aae50;
        auVar97._0_8_ = 0xbe2aae50be2aae50;
        auVar97._12_4_ = 0xbe2aae50;
        auVar52 = vfmadd213ps_fma(auVar52,auVar32,auVar97);
        auVar98._8_4_ = 0x3e4cceac;
        auVar98._0_8_ = 0x3e4cceac3e4cceac;
        auVar98._12_4_ = 0x3e4cceac;
        auVar52 = vfmadd213ps_fma(auVar52,auVar32,auVar98);
        auVar99._8_4_ = 0xbe7ffffc;
        auVar99._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar99._12_4_ = 0xbe7ffffc;
        auVar52 = vfmadd213ps_fma(auVar52,auVar32,auVar99);
        auVar100._8_4_ = 0x3eaaaaaa;
        auVar100._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar100._12_4_ = 0x3eaaaaaa;
        auVar52 = vfmadd213ps_fma(auVar52,auVar32,auVar100);
        auVar101._0_4_ = auVar52._0_4_ * auVar161._0_4_ * auVar32._0_4_;
        auVar101._4_4_ = auVar52._4_4_ * auVar161._4_4_ * auVar32._4_4_;
        auVar101._8_4_ = auVar52._8_4_ * auVar161._8_4_ * auVar32._8_4_;
        auVar101._12_4_ = auVar52._12_4_ * auVar161._12_4_ * auVar32._12_4_;
        auVar52 = vfmadd231ps_fma(auVar101,auVar160,auVar67);
        auVar56 = vfmsub231ps_fma(auVar52,auVar21,auVar161);
        auVar52 = vcmpps_avx(auVar23,_DAT_004c3030,2);
        auVar56 = vsubps_avx(auVar56,auVar32);
        auVar160 = vfnmadd231ps_fma(auVar56,auVar148,auVar160);
        auVar33._0_4_ = auVar160._0_4_ + auVar160._0_4_;
        auVar33._4_4_ = auVar160._4_4_ + auVar160._4_4_;
        auVar33._8_4_ = auVar160._8_4_ + auVar160._8_4_;
        auVar33._12_4_ = auVar160._12_4_ + auVar160._12_4_;
        auVar53._8_4_ = 0x7fffffff;
        auVar53._0_8_ = 0x7fffffff7fffffff;
        auVar53._12_4_ = 0x7fffffff;
        auVar52 = vblendvps_avx(auVar33,auVar53,auVar52);
        auVar52 = vminps_avx(auVar153,auVar52);
        auVar56 = vmaxps_avx(auVar165,auVar52);
        auVar54._8_4_ = 0x3fb8aa3b;
        auVar54._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar54._12_4_ = 0x3fb8aa3b;
        auVar52 = vfmadd213ps_fma(auVar54,auVar56,auVar21);
        auVar102._0_4_ = (int)auVar52._0_4_;
        auVar102._4_4_ = (int)auVar52._4_4_;
        auVar102._8_4_ = (int)auVar52._8_4_;
        auVar102._12_4_ = (int)auVar52._12_4_;
        auVar160 = vcvtdq2ps_avx(auVar102);
        auVar52 = vcmpps_avx(auVar52,auVar160,1);
        auVar52 = vandps_avx(auVar52,auVar85);
        auVar52 = vsubps_avx(auVar160,auVar52);
        auVar160 = vfmsub231ps_fma(auVar56,auVar52,auVar148);
        auVar56 = vfnmsub231ps_fma(auVar160,auVar52,auVar67);
        auVar103._0_4_ = auVar56._0_4_ * auVar56._0_4_;
        auVar103._4_4_ = auVar56._4_4_ * auVar56._4_4_;
        auVar103._8_4_ = auVar56._8_4_ * auVar56._8_4_;
        auVar103._12_4_ = auVar56._12_4_ * auVar56._12_4_;
        auVar160 = vfmadd213ps_fma(auVar187,auVar56,auVar176);
        auVar160 = vfmadd213ps_fma(auVar160,auVar56,auVar123);
        auVar68._8_4_ = 0x3d2aa9c1;
        auVar68._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar68._12_4_ = 0x3d2aa9c1;
        auVar160 = vfmadd213ps_fma(auVar160,auVar56,auVar68);
        auVar69._8_4_ = 0x3e2aaaaa;
        auVar69._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar69._12_4_ = 0x3e2aaaaa;
        auVar160 = vfmadd213ps_fma(auVar160,auVar56,auVar69);
        auVar160 = vfmadd213ps_fma(auVar160,auVar56,auVar21);
        auVar160 = vfmadd213ps_fma(auVar160,auVar103,auVar56);
        auVar34._0_4_ = auVar160._0_4_ + 1.0;
        auVar34._4_4_ = auVar160._4_4_ + 1.0;
        auVar34._8_4_ = auVar160._8_4_ + 1.0;
        auVar34._12_4_ = auVar160._12_4_ + 1.0;
        auVar55._0_4_ = (int)auVar52._0_4_;
        auVar55._4_4_ = (int)auVar52._4_4_;
        auVar55._8_4_ = (int)auVar52._8_4_;
        auVar55._12_4_ = (int)auVar52._12_4_;
        auVar52 = vpslld_avx(auVar55,0x17);
        auVar52 = vpaddd_avx(auVar52,auVar85);
        auVar160 = vfmadd213ps_fma(auVar52,auVar34,auVar85);
        auVar52 = vrcpps_avx(auVar160);
        auVar104._0_4_ = auVar52._0_4_ + auVar52._0_4_;
        auVar104._4_4_ = auVar52._4_4_ + auVar52._4_4_;
        auVar104._8_4_ = auVar52._8_4_ + auVar52._8_4_;
        auVar104._12_4_ = auVar52._12_4_ + auVar52._12_4_;
        auVar22._8_4_ = 0x40000000;
        auVar22._0_8_ = 0x4000000040000000;
        auVar22._12_4_ = 0x40000000;
        auVar160 = vfmsub213ps_fma(auVar160,auVar104,auVar22);
        auVar52 = vfnmadd213ps_fma(auVar160,auVar52,auVar104);
        auVar35 = vfmsub213ps_fma(auVar52,auVar35,auVar35);
        *pauVar11 = auVar35;
        pauVar11 = pauVar11 + 1;
      }
    }
  }
  else {
    uVar8 = 0;
    uVar9 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar9 = uVar8;
    }
    for (; uVar8 != uVar9; uVar8 = uVar8 + 1) {
      pvVar3 = bottom_top_blob->data;
      sVar4 = bottom_top_blob->elemsize;
      sVar5 = bottom_top_blob->cstep;
      pauVar14 = (undefined1 (*) [32])(sVar5 * uVar8 * sVar4 + (long)pvVar3);
      lVar17 = 0;
      for (iVar16 = 0; iVar16 + 7 < (int)uVar15; iVar16 = iVar16 + 8) {
        auVar91 = *pauVar14;
        auVar151._8_4_ = 0x42b0c0a5;
        auVar151._0_8_ = 0x42b0c0a542b0c0a5;
        auVar151._12_4_ = 0x42b0c0a5;
        auVar151._16_4_ = 0x42b0c0a5;
        auVar151._20_4_ = 0x42b0c0a5;
        auVar151._24_4_ = 0x42b0c0a5;
        auVar151._28_4_ = 0x42b0c0a5;
        auVar150 = vminps_avx(auVar91,auVar151);
        auVar158._8_4_ = 0xc2b0c0a5;
        auVar158._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar158._12_4_ = 0xc2b0c0a5;
        auVar158._16_4_ = 0xc2b0c0a5;
        auVar158._20_4_ = 0xc2b0c0a5;
        auVar158._24_4_ = 0xc2b0c0a5;
        auVar158._28_4_ = 0xc2b0c0a5;
        auVar45 = vmaxps_avx(auVar158,auVar150);
        auVar175._8_4_ = 0x3fb8aa3b;
        auVar175._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar175._12_4_ = 0x3fb8aa3b;
        auVar175._16_4_ = 0x3fb8aa3b;
        auVar175._20_4_ = 0x3fb8aa3b;
        auVar175._24_4_ = 0x3fb8aa3b;
        auVar175._28_4_ = 0x3fb8aa3b;
        auVar164._8_4_ = 0x3f000000;
        auVar164._0_8_ = 0x3f0000003f000000;
        auVar164._12_4_ = 0x3f000000;
        auVar164._16_4_ = 0x3f000000;
        auVar164._20_4_ = 0x3f000000;
        auVar164._24_4_ = 0x3f000000;
        auVar164._28_4_ = 0x3f000000;
        auVar35 = vfmadd213ps_fma(auVar175,auVar45,auVar164);
        auVar191 = vroundps_avx(ZEXT1632(auVar35),1);
        auVar150 = vcmpps_avx(ZEXT1632(auVar35),auVar191,1);
        auVar186._8_4_ = 0x3f800000;
        auVar186._0_8_ = 0x3f8000003f800000;
        auVar186._12_4_ = 0x3f800000;
        auVar186._16_4_ = 0x3f800000;
        auVar186._20_4_ = 0x3f800000;
        auVar186._24_4_ = 0x3f800000;
        auVar186._28_4_ = 0x3f800000;
        auVar150 = vandps_avx(auVar186,auVar150);
        auVar150 = vsubps_avx(auVar191,auVar150);
        auVar189._8_4_ = 0x3f318000;
        auVar189._0_8_ = 0x3f3180003f318000;
        auVar189._12_4_ = 0x3f318000;
        auVar189._16_4_ = 0x3f318000;
        auVar189._20_4_ = 0x3f318000;
        auVar189._24_4_ = 0x3f318000;
        auVar189._28_4_ = 0x3f318000;
        auVar35 = vfmsub231ps_fma(auVar45,auVar150,auVar189);
        auVar192._8_4_ = 0xb95e8083;
        auVar192._0_8_ = 0xb95e8083b95e8083;
        auVar192._12_4_ = 0xb95e8083;
        auVar192._16_4_ = 0xb95e8083;
        auVar192._20_4_ = 0xb95e8083;
        auVar192._24_4_ = 0xb95e8083;
        auVar192._28_4_ = 0xb95e8083;
        auVar52 = vfnmsub231ps_fma(ZEXT1632(auVar35),auVar150,auVar192);
        auVar45 = ZEXT1632(auVar52);
        auVar6._28_4_ = auVar191._28_4_;
        auVar6._0_28_ =
             ZEXT1628(CONCAT412(auVar52._12_4_ * auVar52._12_4_,
                                CONCAT48(auVar52._8_4_ * auVar52._8_4_,
                                         CONCAT44(auVar52._4_4_ * auVar52._4_4_,
                                                  auVar52._0_4_ * auVar52._0_4_))));
        auVar201._8_4_ = 0x39506967;
        auVar201._0_8_ = 0x3950696739506967;
        auVar201._12_4_ = 0x39506967;
        auVar201._16_4_ = 0x39506967;
        auVar201._20_4_ = 0x39506967;
        auVar201._24_4_ = 0x39506967;
        auVar201._28_4_ = 0x39506967;
        auVar195._8_4_ = 0x3ab743ce;
        auVar195._0_8_ = 0x3ab743ce3ab743ce;
        auVar195._12_4_ = 0x3ab743ce;
        auVar195._16_4_ = 0x3ab743ce;
        auVar195._20_4_ = 0x3ab743ce;
        auVar195._24_4_ = 0x3ab743ce;
        auVar195._28_4_ = 0x3ab743ce;
        auVar35 = vfmadd213ps_fma(auVar201,auVar45,auVar195);
        auVar115._8_4_ = 0x3c088908;
        auVar115._0_8_ = 0x3c0889083c088908;
        auVar115._12_4_ = 0x3c088908;
        auVar115._16_4_ = 0x3c088908;
        auVar115._20_4_ = 0x3c088908;
        auVar115._24_4_ = 0x3c088908;
        auVar115._28_4_ = 0x3c088908;
        auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar45,auVar115);
        auVar116._8_4_ = 0x3d2aa9c1;
        auVar116._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar116._12_4_ = 0x3d2aa9c1;
        auVar116._16_4_ = 0x3d2aa9c1;
        auVar116._20_4_ = 0x3d2aa9c1;
        auVar116._24_4_ = 0x3d2aa9c1;
        auVar116._28_4_ = 0x3d2aa9c1;
        auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar45,auVar116);
        auVar117._8_4_ = 0x3e2aaaaa;
        auVar117._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar117._12_4_ = 0x3e2aaaaa;
        auVar117._16_4_ = 0x3e2aaaaa;
        auVar117._20_4_ = 0x3e2aaaaa;
        auVar117._24_4_ = 0x3e2aaaaa;
        auVar117._28_4_ = 0x3e2aaaaa;
        auVar45 = ZEXT1632(auVar52);
        auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar45,auVar117);
        auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar45,auVar164);
        auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar6,auVar45);
        auVar82._0_4_ = auVar35._0_4_ + 1.0;
        auVar82._4_4_ = auVar35._4_4_ + 1.0;
        auVar82._8_4_ = auVar35._8_4_ + 1.0;
        auVar82._12_4_ = auVar35._12_4_ + 1.0;
        auVar82._16_4_ = 0x3f800000;
        auVar82._20_4_ = 0x3f800000;
        auVar82._24_4_ = 0x3f800000;
        auVar82._28_4_ = 0x3f800000;
        auVar160._0_4_ = (int)auVar150._0_4_;
        auVar160._4_4_ = (int)auVar150._4_4_;
        auVar160._8_4_ = (int)auVar150._8_4_;
        auVar160._12_4_ = (int)auVar150._12_4_;
        auVar46._16_4_ = (int)auVar150._16_4_;
        auVar46._0_16_ = auVar160;
        auVar46._20_4_ = (int)auVar150._20_4_;
        auVar46._24_4_ = (int)auVar150._24_4_;
        auVar46._28_4_ = (int)auVar150._28_4_;
        auVar52 = vpslld_avx(auVar160,0x17);
        auVar35 = vpslld_avx(auVar46._16_16_,0x17);
        auVar23._8_4_ = 0x3f800000;
        auVar23._0_8_ = 0x3f8000003f800000;
        auVar23._12_4_ = 0x3f800000;
        auVar35 = vpaddd_avx(auVar35,auVar23);
        auVar52 = vpaddd_avx(auVar52,auVar23);
        auVar47._16_16_ = auVar35;
        auVar47._0_16_ = auVar52;
        auVar160 = vfmadd213ps_fma(auVar47,auVar82,auVar186);
        auVar62._8_4_ = 0x800000;
        auVar62._0_8_ = 0x80000000800000;
        auVar62._12_4_ = 0x800000;
        auVar62._16_4_ = 0x800000;
        auVar62._20_4_ = 0x800000;
        auVar62._24_4_ = 0x800000;
        auVar62._28_4_ = 0x800000;
        auVar150 = vmaxps_avx(ZEXT1632(auVar160),auVar62);
        auVar52 = vpsrld_avx(auVar150._0_16_,0x17);
        auVar35 = vpsrld_avx(auVar150._16_16_,0x17);
        auVar118._8_4_ = 0x807fffff;
        auVar118._0_8_ = 0x807fffff807fffff;
        auVar118._12_4_ = 0x807fffff;
        auVar118._16_4_ = 0x807fffff;
        auVar118._20_4_ = 0x807fffff;
        auVar118._24_4_ = 0x807fffff;
        auVar118._28_4_ = 0x807fffff;
        auVar150 = vandps_avx(auVar150,auVar118);
        auVar191 = vorps_avx(auVar164,auVar150);
        auVar119._8_4_ = 0x3f3504f3;
        auVar119._0_8_ = 0x3f3504f33f3504f3;
        auVar119._12_4_ = 0x3f3504f3;
        auVar119._16_4_ = 0x3f3504f3;
        auVar119._20_4_ = 0x3f3504f3;
        auVar119._24_4_ = 0x3f3504f3;
        auVar119._28_4_ = 0x3f3504f3;
        auVar45 = vcmpps_avx(auVar119,auVar191,2);
        auVar150 = vandnps_avx(auVar45,auVar191);
        auVar152._8_4_ = 0xbf800000;
        auVar152._0_8_ = 0xbf800000bf800000;
        auVar152._12_4_ = 0xbf800000;
        auVar152._16_4_ = 0xbf800000;
        auVar152._20_4_ = 0xbf800000;
        auVar152._24_4_ = 0xbf800000;
        auVar152._28_4_ = 0xbf800000;
        auVar63._0_4_ = auVar191._0_4_ + -1.0 + auVar150._0_4_;
        auVar63._4_4_ = auVar191._4_4_ + -1.0 + auVar150._4_4_;
        auVar63._8_4_ = auVar191._8_4_ + -1.0 + auVar150._8_4_;
        auVar63._12_4_ = auVar191._12_4_ + -1.0 + auVar150._12_4_;
        auVar63._16_4_ = auVar191._16_4_ + -1.0 + auVar150._16_4_;
        auVar63._20_4_ = auVar191._20_4_ + -1.0 + auVar150._20_4_;
        auVar63._24_4_ = auVar191._24_4_ + -1.0 + auVar150._24_4_;
        auVar63._28_4_ = auVar191._28_4_ + -1.0 + auVar150._28_4_;
        auVar35 = vpsubd_avx(auVar35,auVar45._16_16_);
        auVar124._8_4_ = 0xffffff81;
        auVar124._0_8_ = 0xffffff81ffffff81;
        auVar124._12_4_ = 0xffffff81;
        auVar35 = vpaddd_avx(auVar35,auVar124);
        auVar52 = vpsubd_avx(auVar52,auVar45._0_16_);
        auVar52 = vpaddd_avx(auVar52,auVar124);
        auVar83._16_16_ = auVar35;
        auVar83._0_16_ = auVar52;
        auVar92._0_4_ = auVar63._0_4_ * auVar63._0_4_;
        auVar92._4_4_ = auVar63._4_4_ * auVar63._4_4_;
        auVar92._8_4_ = auVar63._8_4_ * auVar63._8_4_;
        auVar92._12_4_ = auVar63._12_4_ * auVar63._12_4_;
        auVar92._16_4_ = auVar63._16_4_ * auVar63._16_4_;
        auVar92._20_4_ = auVar63._20_4_ * auVar63._20_4_;
        auVar92._24_4_ = auVar63._24_4_ * auVar63._24_4_;
        auVar92._28_4_ = 0;
        auVar120._8_4_ = 0x3d9021bb;
        auVar120._0_8_ = 0x3d9021bb3d9021bb;
        auVar120._12_4_ = 0x3d9021bb;
        auVar120._16_4_ = 0x3d9021bb;
        auVar120._20_4_ = 0x3d9021bb;
        auVar120._24_4_ = 0x3d9021bb;
        auVar120._28_4_ = 0x3d9021bb;
        auVar137._8_4_ = 0xbdebd1b8;
        auVar137._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar137._12_4_ = 0xbdebd1b8;
        auVar137._16_4_ = 0xbdebd1b8;
        auVar137._20_4_ = 0xbdebd1b8;
        auVar137._24_4_ = 0xbdebd1b8;
        auVar137._28_4_ = 0xbdebd1b8;
        auVar35 = vfmadd213ps_fma(auVar120,auVar63,auVar137);
        auVar138._8_4_ = 0x3def251a;
        auVar138._0_8_ = 0x3def251a3def251a;
        auVar138._12_4_ = 0x3def251a;
        auVar138._16_4_ = 0x3def251a;
        auVar138._20_4_ = 0x3def251a;
        auVar138._24_4_ = 0x3def251a;
        auVar138._28_4_ = 0x3def251a;
        auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar63,auVar138);
        auVar139._8_4_ = 0xbdfe5d4f;
        auVar139._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar139._12_4_ = 0xbdfe5d4f;
        auVar139._16_4_ = 0xbdfe5d4f;
        auVar139._20_4_ = 0xbdfe5d4f;
        auVar139._24_4_ = 0xbdfe5d4f;
        auVar139._28_4_ = 0xbdfe5d4f;
        auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar63,auVar139);
        auVar140._8_4_ = 0x3e11e9bf;
        auVar140._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar140._12_4_ = 0x3e11e9bf;
        auVar140._16_4_ = 0x3e11e9bf;
        auVar140._20_4_ = 0x3e11e9bf;
        auVar140._24_4_ = 0x3e11e9bf;
        auVar140._28_4_ = 0x3e11e9bf;
        auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar63,auVar140);
        auVar141._8_4_ = 0xbe2aae50;
        auVar141._0_8_ = 0xbe2aae50be2aae50;
        auVar141._12_4_ = 0xbe2aae50;
        auVar141._16_4_ = 0xbe2aae50;
        auVar141._20_4_ = 0xbe2aae50;
        auVar141._24_4_ = 0xbe2aae50;
        auVar141._28_4_ = 0xbe2aae50;
        auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar63,auVar141);
        auVar142._8_4_ = 0x3e4cceac;
        auVar142._0_8_ = 0x3e4cceac3e4cceac;
        auVar142._12_4_ = 0x3e4cceac;
        auVar142._16_4_ = 0x3e4cceac;
        auVar142._20_4_ = 0x3e4cceac;
        auVar142._24_4_ = 0x3e4cceac;
        auVar142._28_4_ = 0x3e4cceac;
        auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar63,auVar142);
        auVar143._8_4_ = 0xbe7ffffc;
        auVar143._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar143._12_4_ = 0xbe7ffffc;
        auVar143._16_4_ = 0xbe7ffffc;
        auVar143._20_4_ = 0xbe7ffffc;
        auVar143._24_4_ = 0xbe7ffffc;
        auVar143._28_4_ = 0xbe7ffffc;
        auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar63,auVar143);
        auVar144._8_4_ = 0x3eaaaaaa;
        auVar144._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar144._12_4_ = 0x3eaaaaaa;
        auVar144._16_4_ = 0x3eaaaaaa;
        auVar144._20_4_ = 0x3eaaaaaa;
        auVar144._24_4_ = 0x3eaaaaaa;
        auVar144._28_4_ = 0x3eaaaaaa;
        auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar63,auVar144);
        auVar121._0_4_ = auVar92._0_4_ * auVar63._0_4_ * auVar35._0_4_;
        auVar121._4_4_ = auVar92._4_4_ * auVar63._4_4_ * auVar35._4_4_;
        auVar121._8_4_ = auVar92._8_4_ * auVar63._8_4_ * auVar35._8_4_;
        auVar121._12_4_ = auVar92._12_4_ * auVar63._12_4_ * auVar35._12_4_;
        auVar121._16_4_ = auVar92._16_4_ * auVar63._16_4_ * 0.0;
        auVar121._20_4_ = auVar92._20_4_ * auVar63._20_4_ * 0.0;
        auVar121._24_4_ = auVar92._24_4_ * auVar63._24_4_ * 0.0;
        auVar121._28_4_ = 0;
        auVar45 = vcvtdq2ps_avx(auVar83);
        auVar35 = vfmadd231ps_fma(auVar121,auVar45,auVar192);
        auVar35 = vfmsub231ps_fma(ZEXT1632(auVar35),auVar164,auVar92);
        auVar150 = vcmpps_avx(ZEXT1632(auVar160),_DAT_004c7360,2);
        auVar191 = vsubps_avx(ZEXT1632(auVar35),auVar63);
        auVar35 = vfmsub231ps_fma(auVar191,auVar189,auVar45);
        auVar122._8_4_ = 0xc0000000;
        auVar122._0_8_ = 0xc0000000c0000000;
        auVar122._12_4_ = 0xc0000000;
        auVar122._16_4_ = 0xc0000000;
        auVar122._20_4_ = 0xc0000000;
        auVar122._24_4_ = 0xc0000000;
        auVar122._28_4_ = 0xc0000000;
        auVar64._0_4_ = auVar35._0_4_ * -2.0;
        auVar64._4_4_ = auVar35._4_4_ * -2.0;
        auVar64._8_4_ = auVar35._8_4_ * -2.0;
        auVar64._12_4_ = auVar35._12_4_ * -2.0;
        auVar64._16_4_ = 0x80000000;
        auVar64._20_4_ = 0x80000000;
        auVar64._24_4_ = 0x80000000;
        auVar64._28_4_ = 0;
        auVar84._8_4_ = 0x7fffffff;
        auVar84._0_8_ = 0x7fffffff7fffffff;
        auVar84._12_4_ = 0x7fffffff;
        auVar84._16_4_ = 0x7fffffff;
        auVar84._20_4_ = 0x7fffffff;
        auVar84._24_4_ = 0x7fffffff;
        auVar84._28_4_ = 0x7fffffff;
        auVar150 = vblendvps_avx(auVar64,auVar84,auVar150);
        auVar65._8_4_ = 0x42b0c0a5;
        auVar65._0_8_ = 0x42b0c0a542b0c0a5;
        auVar65._12_4_ = 0x42b0c0a5;
        auVar65._16_4_ = 0x42b0c0a5;
        auVar65._20_4_ = 0x42b0c0a5;
        auVar65._24_4_ = 0x42b0c0a5;
        auVar65._28_4_ = 0x42b0c0a5;
        auVar150 = vminps_avx(auVar150,auVar65);
        auVar45 = vmaxps_avx(auVar158,auVar150);
        auVar35 = vfmadd213ps_fma(auVar175,auVar45,auVar164);
        auVar191 = vroundps_avx(ZEXT1632(auVar35),1);
        auVar150 = vcmpps_avx(ZEXT1632(auVar35),auVar191,1);
        auVar150 = vandps_avx(auVar186,auVar150);
        auVar150 = vsubps_avx(auVar191,auVar150);
        auVar35 = vfmsub231ps_fma(auVar45,auVar150,auVar189);
        auVar52 = vfnmsub231ps_fma(ZEXT1632(auVar35),auVar150,auVar192);
        auVar45 = ZEXT1632(auVar52);
        auVar7._28_4_ = auVar191._28_4_;
        auVar7._0_28_ =
             ZEXT1628(CONCAT412(auVar52._12_4_ * auVar52._12_4_,
                                CONCAT48(auVar52._8_4_ * auVar52._8_4_,
                                         CONCAT44(auVar52._4_4_ * auVar52._4_4_,
                                                  auVar52._0_4_ * auVar52._0_4_))));
        auVar35 = vfmadd213ps_fma(auVar201,auVar45,auVar195);
        auVar145._8_4_ = 0x3c088908;
        auVar145._0_8_ = 0x3c0889083c088908;
        auVar145._12_4_ = 0x3c088908;
        auVar145._16_4_ = 0x3c088908;
        auVar145._20_4_ = 0x3c088908;
        auVar145._24_4_ = 0x3c088908;
        auVar145._28_4_ = 0x3c088908;
        auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar45,auVar145);
        auVar146._8_4_ = 0x3d2aa9c1;
        auVar146._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar146._12_4_ = 0x3d2aa9c1;
        auVar146._16_4_ = 0x3d2aa9c1;
        auVar146._20_4_ = 0x3d2aa9c1;
        auVar146._24_4_ = 0x3d2aa9c1;
        auVar146._28_4_ = 0x3d2aa9c1;
        auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar45,auVar146);
        auVar147._8_4_ = 0x3e2aaaaa;
        auVar147._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar147._12_4_ = 0x3e2aaaaa;
        auVar147._16_4_ = 0x3e2aaaaa;
        auVar147._20_4_ = 0x3e2aaaaa;
        auVar147._24_4_ = 0x3e2aaaaa;
        auVar147._28_4_ = 0x3e2aaaaa;
        auVar45 = ZEXT1632(auVar52);
        auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar45,auVar147);
        auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar45,auVar164);
        auVar160 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar7,auVar45);
        auVar36._0_4_ = (int)auVar150._0_4_;
        auVar36._4_4_ = (int)auVar150._4_4_;
        auVar36._8_4_ = (int)auVar150._8_4_;
        auVar36._12_4_ = (int)auVar150._12_4_;
        auVar48._16_4_ = (int)auVar150._16_4_;
        auVar48._0_16_ = auVar36;
        auVar48._20_4_ = (int)auVar150._20_4_;
        auVar48._24_4_ = (int)auVar150._24_4_;
        auVar48._28_4_ = (int)auVar150._28_4_;
        auVar52 = vpslld_avx(auVar36,0x17);
        auVar35 = vpslld_avx(auVar48._16_16_,0x17);
        auVar35 = vpaddd_avx(auVar35,auVar23);
        auVar52 = vpaddd_avx(auVar52,auVar23);
        auVar49._16_16_ = auVar35;
        auVar49._0_16_ = auVar52;
        auVar66._0_4_ = auVar160._0_4_ + 1.0;
        auVar66._4_4_ = auVar160._4_4_ + 1.0;
        auVar66._8_4_ = auVar160._8_4_ + 1.0;
        auVar66._12_4_ = auVar160._12_4_ + 1.0;
        auVar66._16_4_ = 0x3f800000;
        auVar66._20_4_ = 0x3f800000;
        auVar66._24_4_ = 0x3f800000;
        auVar66._28_4_ = 0x3f800000;
        auVar35 = vfmadd213ps_fma(auVar49,auVar66,auVar186);
        auVar150 = vrcpps_avx(ZEXT1632(auVar35));
        auVar35 = vfmsub213ps_fma(ZEXT1632(auVar35),auVar150,auVar186);
        auVar35 = vfnmadd132ps_fma(ZEXT1632(auVar35),auVar150,auVar150);
        auVar35 = vfnmadd213ps_fma(ZEXT1632(auVar35),auVar122,auVar152);
        local_58 = auVar91._0_4_;
        fStack_54 = auVar91._4_4_;
        fStack_50 = auVar91._8_4_;
        fStack_4c = auVar91._12_4_;
        fStack_48 = auVar91._16_4_;
        fStack_44 = auVar91._20_4_;
        fStack_40 = auVar91._24_4_;
        auVar25._0_4_ = auVar35._0_4_ * local_58;
        auVar25._4_4_ = auVar35._4_4_ * fStack_54;
        auVar25._8_4_ = auVar35._8_4_ * fStack_50;
        auVar25._12_4_ = auVar35._12_4_ * fStack_4c;
        auVar25._16_4_ = fStack_48 * 0.0;
        auVar25._20_4_ = fStack_44 * 0.0;
        auVar25._24_4_ = fStack_40 * 0.0;
        auVar25._28_4_ = 0;
        *pauVar14 = auVar25;
        pauVar14 = pauVar14 + 1;
        lVar17 = lVar17 + 8;
      }
      for (; iVar16 + 3 < (int)uVar15; iVar16 = iVar16 + 4) {
        auVar35 = *(undefined1 (*) [16])*pauVar14;
        auVar154._8_4_ = 0x42b0c0a5;
        auVar154._0_8_ = 0x42b0c0a542b0c0a5;
        auVar154._12_4_ = 0x42b0c0a5;
        auVar52 = vminps_avx(auVar154,auVar35);
        auVar162._8_4_ = 0xc2b0c0a5;
        auVar162._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar162._12_4_ = 0xc2b0c0a5;
        auVar56 = vmaxps_avx(auVar162,auVar52);
        auVar167._8_4_ = 0x3fb8aa3b;
        auVar167._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar167._12_4_ = 0x3fb8aa3b;
        auVar177._8_4_ = 0x3f000000;
        auVar177._0_8_ = 0x3f0000003f000000;
        auVar177._12_4_ = 0x3f000000;
        auVar52 = vfmadd213ps_fma(auVar167,auVar56,auVar177);
        auVar70._0_4_ = (int)auVar52._0_4_;
        auVar70._4_4_ = (int)auVar52._4_4_;
        auVar70._8_4_ = (int)auVar52._8_4_;
        auVar70._12_4_ = (int)auVar52._12_4_;
        auVar160 = vcvtdq2ps_avx(auVar70);
        auVar52 = vcmpps_avx(auVar52,auVar160,1);
        auVar149._8_4_ = 0x3f800000;
        auVar149._0_8_ = 0x3f8000003f800000;
        auVar149._12_4_ = 0x3f800000;
        auVar52 = vandps_avx(auVar52,auVar149);
        auVar52 = vsubps_avx(auVar160,auVar52);
        auVar188._8_4_ = 0x3f318000;
        auVar188._0_8_ = 0x3f3180003f318000;
        auVar188._12_4_ = 0x3f318000;
        auVar160 = vfmsub231ps_fma(auVar56,auVar52,auVar188);
        auVar190._8_4_ = 0xb95e8083;
        auVar190._0_8_ = 0xb95e8083b95e8083;
        auVar190._12_4_ = 0xb95e8083;
        auVar56 = vfnmsub231ps_fma(auVar160,auVar52,auVar190);
        auVar71._0_4_ = auVar56._0_4_ * auVar56._0_4_;
        auVar71._4_4_ = auVar56._4_4_ * auVar56._4_4_;
        auVar71._8_4_ = auVar56._8_4_ * auVar56._8_4_;
        auVar71._12_4_ = auVar56._12_4_ * auVar56._12_4_;
        auVar199._8_4_ = 0x39506967;
        auVar199._0_8_ = 0x3950696739506967;
        auVar199._12_4_ = 0x39506967;
        auVar193._8_4_ = 0x3ab743ce;
        auVar193._0_8_ = 0x3ab743ce3ab743ce;
        auVar193._12_4_ = 0x3ab743ce;
        auVar160 = vfmadd213ps_fma(auVar199,auVar56,auVar193);
        auVar105._8_4_ = 0x3c088908;
        auVar105._0_8_ = 0x3c0889083c088908;
        auVar105._12_4_ = 0x3c088908;
        auVar160 = vfmadd213ps_fma(auVar160,auVar56,auVar105);
        auVar106._8_4_ = 0x3d2aa9c1;
        auVar106._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar106._12_4_ = 0x3d2aa9c1;
        auVar160 = vfmadd213ps_fma(auVar160,auVar56,auVar106);
        auVar107._8_4_ = 0x3e2aaaaa;
        auVar107._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar107._12_4_ = 0x3e2aaaaa;
        auVar160 = vfmadd213ps_fma(auVar160,auVar56,auVar107);
        auVar160 = vfmadd213ps_fma(auVar160,auVar56,auVar177);
        auVar160 = vfmadd213ps_fma(auVar160,auVar71,auVar56);
        auVar72._0_4_ = auVar160._0_4_ + 1.0;
        auVar72._4_4_ = auVar160._4_4_ + 1.0;
        auVar72._8_4_ = auVar160._8_4_ + 1.0;
        auVar72._12_4_ = auVar160._12_4_ + 1.0;
        auVar37._0_4_ = (int)auVar52._0_4_;
        auVar37._4_4_ = (int)auVar52._4_4_;
        auVar37._8_4_ = (int)auVar52._8_4_;
        auVar37._12_4_ = (int)auVar52._12_4_;
        auVar52 = vpslld_avx(auVar37,0x17);
        auVar52 = vpaddd_avx(auVar52,auVar149);
        auVar23 = vfmadd213ps_fma(auVar52,auVar72,auVar149);
        auVar57._8_4_ = 0x800000;
        auVar57._0_8_ = 0x80000000800000;
        auVar57._12_4_ = 0x800000;
        auVar52 = vmaxps_avx(auVar23,auVar57);
        auVar160 = vpsrld_avx(auVar52,0x17);
        auVar86._8_4_ = 0xffffff82;
        auVar86._0_8_ = 0xffffff82ffffff82;
        auVar86._12_4_ = 0xffffff82;
        auVar160 = vpaddd_avx(auVar160,auVar86);
        auVar87._8_4_ = 0x807fffff;
        auVar87._0_8_ = 0x807fffff807fffff;
        auVar87._12_4_ = 0x807fffff;
        auVar52 = vandps_avx(auVar52,auVar87);
        auVar166 = vorps_avx(auVar177,auVar52);
        auVar56 = vcvtdq2ps_avx(auVar160);
        auVar88._8_4_ = 0x3f3504f3;
        auVar88._0_8_ = 0x3f3504f33f3504f3;
        auVar88._12_4_ = 0x3f3504f3;
        auVar160 = vcmpps_avx(auVar166,auVar88,1);
        auVar52 = vandps_avx(auVar160,auVar166);
        auVar58._0_4_ = auVar166._0_4_ + -1.0 + auVar52._0_4_;
        auVar58._4_4_ = auVar166._4_4_ + -1.0 + auVar52._4_4_;
        auVar58._8_4_ = auVar166._8_4_ + -1.0 + auVar52._8_4_;
        auVar58._12_4_ = auVar166._12_4_ + -1.0 + auVar52._12_4_;
        auVar52 = vandps_avx(auVar160,auVar149);
        auVar160 = vsubps_avx(auVar56,auVar52);
        auVar89._0_4_ = auVar58._0_4_ * auVar58._0_4_;
        auVar89._4_4_ = auVar58._4_4_ * auVar58._4_4_;
        auVar89._8_4_ = auVar58._8_4_ * auVar58._8_4_;
        auVar89._12_4_ = auVar58._12_4_ * auVar58._12_4_;
        auVar108._8_4_ = 0x3d9021bb;
        auVar108._0_8_ = 0x3d9021bb3d9021bb;
        auVar108._12_4_ = 0x3d9021bb;
        auVar125._8_4_ = 0xbdebd1b8;
        auVar125._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar125._12_4_ = 0xbdebd1b8;
        auVar52 = vfmadd213ps_fma(auVar108,auVar58,auVar125);
        auVar126._8_4_ = 0x3def251a;
        auVar126._0_8_ = 0x3def251a3def251a;
        auVar126._12_4_ = 0x3def251a;
        auVar52 = vfmadd213ps_fma(auVar52,auVar58,auVar126);
        auVar127._8_4_ = 0xbdfe5d4f;
        auVar127._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar127._12_4_ = 0xbdfe5d4f;
        auVar52 = vfmadd213ps_fma(auVar52,auVar58,auVar127);
        auVar128._8_4_ = 0x3e11e9bf;
        auVar128._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar128._12_4_ = 0x3e11e9bf;
        auVar52 = vfmadd213ps_fma(auVar52,auVar58,auVar128);
        auVar129._8_4_ = 0xbe2aae50;
        auVar129._0_8_ = 0xbe2aae50be2aae50;
        auVar129._12_4_ = 0xbe2aae50;
        auVar52 = vfmadd213ps_fma(auVar52,auVar58,auVar129);
        auVar130._8_4_ = 0x3e4cceac;
        auVar130._0_8_ = 0x3e4cceac3e4cceac;
        auVar130._12_4_ = 0x3e4cceac;
        auVar52 = vfmadd213ps_fma(auVar52,auVar58,auVar130);
        auVar131._8_4_ = 0xbe7ffffc;
        auVar131._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar131._12_4_ = 0xbe7ffffc;
        auVar52 = vfmadd213ps_fma(auVar52,auVar58,auVar131);
        auVar132._8_4_ = 0x3eaaaaaa;
        auVar132._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar132._12_4_ = 0x3eaaaaaa;
        auVar52 = vfmadd213ps_fma(auVar52,auVar58,auVar132);
        auVar109._0_4_ = auVar89._0_4_ * auVar58._0_4_ * auVar52._0_4_;
        auVar109._4_4_ = auVar89._4_4_ * auVar58._4_4_ * auVar52._4_4_;
        auVar109._8_4_ = auVar89._8_4_ * auVar58._8_4_ * auVar52._8_4_;
        auVar109._12_4_ = auVar89._12_4_ * auVar58._12_4_ * auVar52._12_4_;
        auVar52 = vfmadd231ps_fma(auVar109,auVar160,auVar190);
        auVar56 = vfmsub231ps_fma(auVar52,auVar177,auVar89);
        auVar52 = vcmpps_avx(auVar23,_DAT_004c3030,2);
        auVar56 = vsubps_avx(auVar56,auVar58);
        auVar160 = vfnmadd231ps_fma(auVar56,auVar188,auVar160);
        auVar59._0_4_ = auVar160._0_4_ + auVar160._0_4_;
        auVar59._4_4_ = auVar160._4_4_ + auVar160._4_4_;
        auVar59._8_4_ = auVar160._8_4_ + auVar160._8_4_;
        auVar59._12_4_ = auVar160._12_4_ + auVar160._12_4_;
        auVar73._8_4_ = 0x7fffffff;
        auVar73._0_8_ = 0x7fffffff7fffffff;
        auVar73._12_4_ = 0x7fffffff;
        auVar52 = vblendvps_avx(auVar59,auVar73,auVar52);
        auVar52 = vminps_avx(auVar154,auVar52);
        auVar56 = vmaxps_avx(auVar162,auVar52);
        auVar52 = vfmadd213ps_fma(auVar167,auVar56,auVar177);
        auVar74._0_4_ = (int)auVar52._0_4_;
        auVar74._4_4_ = (int)auVar52._4_4_;
        auVar74._8_4_ = (int)auVar52._8_4_;
        auVar74._12_4_ = (int)auVar52._12_4_;
        auVar160 = vcvtdq2ps_avx(auVar74);
        auVar52 = vcmpps_avx(auVar52,auVar160,1);
        auVar52 = vandps_avx(auVar52,auVar149);
        auVar52 = vsubps_avx(auVar160,auVar52);
        auVar160 = vfmsub231ps_fma(auVar56,auVar52,auVar188);
        auVar56 = vfnmsub231ps_fma(auVar160,auVar52,auVar190);
        auVar75._0_4_ = auVar56._0_4_ * auVar56._0_4_;
        auVar75._4_4_ = auVar56._4_4_ * auVar56._4_4_;
        auVar75._8_4_ = auVar56._8_4_ * auVar56._8_4_;
        auVar75._12_4_ = auVar56._12_4_ * auVar56._12_4_;
        auVar160 = vfmadd213ps_fma(auVar199,auVar56,auVar193);
        auVar110._8_4_ = 0x3c088908;
        auVar110._0_8_ = 0x3c0889083c088908;
        auVar110._12_4_ = 0x3c088908;
        auVar160 = vfmadd213ps_fma(auVar160,auVar56,auVar110);
        auVar111._8_4_ = 0x3d2aa9c1;
        auVar111._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar111._12_4_ = 0x3d2aa9c1;
        auVar160 = vfmadd213ps_fma(auVar160,auVar56,auVar111);
        auVar112._8_4_ = 0x3e2aaaaa;
        auVar112._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar112._12_4_ = 0x3e2aaaaa;
        auVar160 = vfmadd213ps_fma(auVar160,auVar56,auVar112);
        auVar160 = vfmadd213ps_fma(auVar160,auVar56,auVar177);
        auVar160 = vfmadd213ps_fma(auVar160,auVar75,auVar56);
        auVar38._0_4_ = auVar160._0_4_ + 1.0;
        auVar38._4_4_ = auVar160._4_4_ + 1.0;
        auVar38._8_4_ = auVar160._8_4_ + 1.0;
        auVar38._12_4_ = auVar160._12_4_ + 1.0;
        auVar60._0_4_ = (int)auVar52._0_4_;
        auVar60._4_4_ = (int)auVar52._4_4_;
        auVar60._8_4_ = (int)auVar52._8_4_;
        auVar60._12_4_ = (int)auVar52._12_4_;
        auVar52 = vpslld_avx(auVar60,0x17);
        auVar52 = vpaddd_avx(auVar52,auVar149);
        auVar160 = vfmadd213ps_fma(auVar52,auVar38,auVar149);
        auVar52 = vrcpps_avx(auVar160);
        auVar76._0_4_ = auVar52._0_4_ + auVar52._0_4_;
        auVar76._4_4_ = auVar52._4_4_ + auVar52._4_4_;
        auVar76._8_4_ = auVar52._8_4_ + auVar52._8_4_;
        auVar76._12_4_ = auVar52._12_4_ + auVar52._12_4_;
        auVar90._8_4_ = 0x40000000;
        auVar90._0_8_ = 0x4000000040000000;
        auVar90._12_4_ = 0x40000000;
        auVar160 = vfmsub213ps_fma(auVar160,auVar76,auVar90);
        auVar52 = vfnmadd213ps_fma(auVar160,auVar52,auVar76);
        auVar35 = vfmsub213ps_fma(auVar52,auVar35,auVar35);
        *(undefined1 (*) [16])*pauVar14 = auVar35;
        pauVar14 = (undefined1 (*) [32])(*pauVar14 + 0x10);
        lVar17 = lVar17 + 4;
      }
      lVar10 = sVar5 * sVar4 * uVar8;
      for (; (int)lVar17 < (int)uVar15; lVar17 = lVar17 + 1) {
        __x = *(float *)((long)pvVar3 + lVar17 * 4 + lVar10);
        fVar20 = expf(__x);
        fVar20 = logf(fVar20 + 1.0);
        fVar20 = tanhf(fVar20);
        *(float *)((long)pvVar3 + lVar17 * 4 + lVar10) = fVar20 * __x;
      }
    }
  }
  return 0;
}

Assistant:

int Mish_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        Mat tmp;
        convert_packing(bottom_top_blob, tmp, 8, opt);

        forward_inplace(tmp, opt);

        convert_packing(tmp, bottom_top_blob, 16, opt);

        return 0;
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = mish_avx(_p);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                _p = mish_sse(_p);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = mish_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = mish_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr * tanh(log(exp(*ptr) + 1.f));
            ptr++;
        }
    }

    return 0;
}